

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::eval::
Dot_Access_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval_internal
          (Dot_Access_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
           *this,Dispatch_State *t_ss)

{
  long lVar1;
  undefined8 *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  size_t *in_RDX;
  File_Position FVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar8;
  ulong uVar9;
  File_Position FVar10;
  undefined8 *puVar11;
  Boxed_Value BVar12;
  string_view t_name;
  array<chaiscript::Boxed_Value,_2UL> p;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> params;
  undefined8 uStack_e0;
  undefined1 local_d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined1 local_a8 [32];
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> local_88;
  pthread_rwlock_t local_70;
  
  chaiscript::detail::Dispatch_Engine::new_function_call
            ((Dispatch_Engine *)*in_RDX,(Stack_Holder *)in_RDX[1],(Conversion_Saves *)in_RDX[3]);
  local_b8._8_8_ = in_RDX;
  BVar12 = AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
                     (&this->
                       super_AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
                      ,(Dispatch_State *)
                       ((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl._M_rwlock.
                       __align);
  local_b8._M_allocated_capacity = (size_type)this;
  make_container<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>,chaiscript::Boxed_Value&>
            (&local_88,(chaiscript *)this,
             (Boxed_Value *)
             BVar12.m_data.
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  lVar8 = *(long *)((long)&((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl.
                           _M_rwlock + 8);
  lVar1 = *(long *)(lVar8 + 0x50);
  uVar9 = *(long *)(lVar8 + 0x58) - lVar1;
  if (8 < uVar9) {
    lVar8 = *(long *)(lVar1 + 8);
    puVar11 = *(undefined8 **)(lVar8 + 0x50);
    puVar2 = *(undefined8 **)(lVar8 + 0x58);
    if (puVar11 != puVar2) {
      do {
        AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
                  ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *
                   )local_d8,(Dispatch_State *)*puVar11);
        std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::
        emplace_back<chaiscript::Boxed_Value>(&local_88,(Boxed_Value *)local_d8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
        }
        puVar11 = puVar11 + 1;
      } while (puVar11 != puVar2);
    }
  }
  FVar7.line = 0;
  FVar7.column = 0;
  local_d8._0_8_ =
       local_88.
       super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>._M_impl
       .super__Vector_impl_data._M_start;
  if (local_88.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_88.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_d8._0_8_ = FVar7;
  }
  local_d8._8_8_ =
       local_88.
       super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (local_88.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_88.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_d8._8_8_ = FVar7;
  }
  chaiscript::detail::Dispatch_Engine::save_function_params
            (*(Dispatch_Engine **)local_b8._8_8_,(Function_Params *)local_d8);
  FVar10.line = 0;
  FVar10.column = 0;
  local_a8._0_8_ =
       local_88.
       super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>._M_impl
       .super__Vector_impl_data._M_start;
  if (local_88.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_88.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_a8._0_8_ = FVar10;
  }
  local_a8._8_8_ =
       local_88.
       super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (local_88.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_88.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_a8._8_8_ = FVar10;
  }
  chaiscript::detail::Dispatch_Engine::call_member
            ((Dispatch_Engine *)local_d8,*(string **)local_b8._8_8_,
             (atomic_uint_fast32_t *)&t_ss[3].m_conversions.m_saves,
             (Function_Params *)&t_ss[3].m_stack_holder,SUB81(local_a8,0),
             (Type_Conversions_State *)(ulong)(8 < uVar9));
  uVar5 = local_d8._8_8_;
  uVar4 = local_d8._0_8_;
  local_d8._0_8_ = (Boxed_Value *)0x0;
  local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar6 = local_d8._8_8_;
  p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_b8._M_allocated_capacity + 8);
  *(undefined8 *)local_b8._M_allocated_capacity = uVar4;
  local_d8._8_4_ = (undefined4)uVar5;
  local_d8._12_4_ = SUB84(uVar5,4);
  ((File_Position *)(local_b8._M_allocated_capacity + 8))->line = local_d8._8_4_;
  ((File_Position *)(local_b8._M_allocated_capacity + 8))->column = local_d8._12_4_;
  local_d8._8_8_ = uVar6;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
  }
  if (*(int *)(*(long *)((long)&((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl.
                                _M_rwlock + 8) + 8) == 7) {
    local_d8._0_8_ = *(undefined8 *)local_b8._M_allocated_capacity;
    local_d8._8_8_ = *(undefined8 *)(local_b8._M_allocated_capacity + 8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count + 1;
      }
    }
    AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
              ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
               (local_d8 + 0x10),
               *(Dispatch_State **)
                (*(long *)(*(long *)((long)&((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)
                                            ._M_impl._M_rwlock + 8) + 0x50) + 8));
    local_70._8_8_ = &local_b8;
    t_name._M_str = (char *)0x2;
    t_name._M_len = *(size_t *)local_b8._8_8_;
    local_70.__align = (long)(Dispatch_Engine *)local_d8;
    chaiscript::detail::Dispatch_Engine::call_function
              ((Dispatch_Engine *)local_a8,t_name,(atomic_uint_fast32_t *)"[]",
               (Function_Params *)&t_ss[3].m_conversions,(Type_Conversions_State *)&local_70.__data)
    ;
    uVar5 = local_a8._8_8_;
    uVar4 = local_a8._0_8_;
    local_a8._0_4_ = 0;
    local_a8._4_4_ = 0;
    local_a8._8_4_ = 0;
    local_a8._12_4_ = 0;
    uVar6 = local_a8._8_8_;
    p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_b8._M_allocated_capacity + 8);
    *(undefined8 *)local_b8._M_allocated_capacity = uVar4;
    local_a8._8_4_ = (undefined4)uVar5;
    local_a8._12_4_ = SUB84(uVar5,4);
    ((File_Position *)(local_b8._M_allocated_capacity + 8))->line = local_a8._8_4_;
    ((File_Position *)(local_b8._M_allocated_capacity + 8))->column = local_a8._12_4_;
    local_a8._8_8_ = uVar6;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if ((File_Position)local_a8._8_8_ != (File_Position)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
    }
    lVar8 = 0x20;
    do {
      if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_e0 + lVar8) !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_e0 + lVar8));
      }
      lVar8 = lVar8 + -0x10;
    } while (lVar8 != 0);
  }
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector(&local_88)
  ;
  chaiscript::detail::Dispatch_Engine::pop_function_call
            (*(Dispatch_Engine **)local_b8._8_8_,*(Stack_Holder **)(local_b8._8_8_ + 8),
             *(Conversion_Saves **)(local_b8._8_8_ + 0x18));
  BVar12.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar12.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)local_b8._M_allocated_capacity;
  return (Boxed_Value)
         BVar12.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        chaiscript::eval::detail::Function_Push_Pop fpp(t_ss);

        Boxed_Value retval = this->children[0]->eval(t_ss);
        auto params = make_vector(retval);

        bool has_function_params = false;
        if (this->children[1]->children.size() > 1) {
          has_function_params = true;
          for (const auto &child : this->children[1]->children[1]->children) {
            params.push_back(child->eval(t_ss));
          }
        }

        fpp.save_params(Function_Params{params});

        try {
          retval = t_ss->call_member(m_fun_name, m_loc, Function_Params{params}, has_function_params, t_ss.conversions());
        } catch (const exception::dispatch_error &e) {
          if (e.functions.empty()) {
            throw exception::eval_error("'" + m_fun_name + "' is not a function.");
          } else {
            throw exception::eval_error(std::string(e.what()) + " for function '" + m_fun_name + "'", e.parameters, e.functions, true, *t_ss);
          }
        } catch (detail::Return_Value &rv) {
          retval = std::move(rv.retval);
        }

        if (this->children[1]->identifier == AST_Node_Type::Array_Call) {
          try {
            std::array<Boxed_Value, 2> p{retval, this->children[1]->children[1]->eval(t_ss)};
            retval = t_ss->call_function("[]", m_array_loc, Function_Params{p}, t_ss.conversions());
          } catch (const exception::dispatch_error &e) {
            throw exception::eval_error("Can not find appropriate array lookup operator '[]'.", e.parameters, e.functions, true, *t_ss);
          }
        }

        return retval;
      }